

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O0

matrix3d * tinyusdz::value::matrix3d::identity(void)

{
  matrix3d *in_RDI;
  matrix3d *m;
  
  matrix3d(in_RDI);
  in_RDI->m[0][0] = 1.0;
  in_RDI->m[0][1] = 0.0;
  in_RDI->m[0][2] = 0.0;
  in_RDI->m[1][0] = 0.0;
  in_RDI->m[1][1] = 1.0;
  in_RDI->m[1][2] = 0.0;
  in_RDI->m[2][0] = 0.0;
  in_RDI->m[2][1] = 0.0;
  in_RDI->m[2][2] = 1.0;
  return in_RDI;
}

Assistant:

static matrix3d identity() {
    matrix3d m;

    m.m[0][0] = 1.0;
    m.m[0][1] = 0.0;
    m.m[0][2] = 0.0;

    m.m[1][0] = 0.0;
    m.m[1][1] = 1.0;
    m.m[1][2] = 0.0;

    m.m[2][0] = 0.0;
    m.m[2][1] = 0.0;
    m.m[2][2] = 1.0;

    return m;
  }